

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::ColorQuant::makePalette(ColorQuant *this,int32 numColors,RGBA *colors)

{
  Node *pNVar1;
  int32 iVar2;
  Node *pNVar3;
  int32 *piVar4;
  Node *n_1;
  LLLink *lnk;
  LLLink *_next;
  int i;
  Node *n;
  RGBA *colors_local;
  int32 numColors_local;
  ColorQuant *this_local;
  
  while( true ) {
    iVar2 = LinkList::count(&this->leaves);
    if (iVar2 <= numColors) break;
    reduceNode(this,(Node *)(this->leaves).link.next[-9].prev);
  }
  _next._4_4_ = 0;
  n_1 = (Node *)(this->leaves).link.next;
  while( true ) {
    pNVar1 = *(Node **)n_1;
    pNVar3 = (Node *)LinkList::end(&this->leaves);
    if (n_1 == pNVar3) break;
    piVar4 = &n_1[-1].numPixels;
    *piVar4 = (uint)*piVar4 / *(uint *)n_1[-1].children;
    *(uint *)&n_1[-1].field_0x14 = *(uint *)&n_1[-1].field_0x14 / *(uint *)n_1[-1].children;
    *(uint *)&n_1[-1].parent = *(uint *)&n_1[-1].parent / *(uint *)n_1[-1].children;
    *(uint *)((long)&n_1[-1].parent + 4) =
         *(uint *)((long)&n_1[-1].parent + 4) / *(uint *)n_1[-1].children;
    colors[_next._4_4_].red = (uint8)*piVar4;
    colors[_next._4_4_].green = (uint8)*(undefined4 *)&n_1[-1].field_0x14;
    colors[_next._4_4_].blue = (uint8)*(undefined4 *)&n_1[-1].parent;
    colors[_next._4_4_].alpha = (uint8)*(undefined4 *)((long)&n_1[-1].parent + 4);
    *(int *)n_1[-1].children = _next._4_4_;
    n_1 = pNVar1;
    _next._4_4_ = _next._4_4_ + 1;
  }
  return;
}

Assistant:

void
ColorQuant::makePalette(int32 numColors, RGBA *colors)
{
	while(this->leaves.count() > numColors){
		Node *n = LLLinkGetData(this->leaves.link.next, Node, link);
		this->reduceNode(n->parent);
	}

	int i = 0;
	FORLIST(lnk, this->leaves){
		Node *n = LLLinkGetData(lnk, Node, link);
		n->r /= n->numPixels;
		n->g /= n->numPixels;
		n->b /= n->numPixels;
		n->a /= n->numPixels;
		colors[i].red = n->r;
		colors[i].green = n->g;
		colors[i].blue = n->b;
		colors[i].alpha = n->a;
		n->numPixels = i++;
	}
}